

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O0

Instr * __thiscall
LinearScan::GeneratorBailIn::GenerateBailIn(GeneratorBailIn *this,GeneratorBailInInstr *bailInInstr)

{
  Instr *insertBeforeInstr;
  RegOpnd *pRVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  uint sourceContextId;
  uint functionId;
  BailOutInfo *pBVar5;
  undefined4 *puVar6;
  SymOpnd *src;
  IndirOpnd *src_00;
  Opnd *dst;
  Instr *insertBailInTraceBefore;
  BailInInsertionPoint insertionPoint;
  IndirOpnd *generatorArgumentsOpnd;
  IndirOpnd *generatorFrameOpnd;
  Instr *instrAfter;
  BailOutInfo *bailOutInfo;
  GeneratorBailInInstr *bailInInstr_local;
  GeneratorBailIn *this_local;
  
  pBVar5 = IR::Instr::GetBailOutInfo(bailInInstr->yieldInstr);
  if ((pBVar5->capturedValues != (CapturedValues *)0x0) &&
     (bVar3 = SListBase<JsUtil::KeyValuePair<StackSym_*,_BailoutConstantValue>,_Memory::ArenaAllocator,_RealCount>
              ::Empty(&pBVar5->capturedValues->constantValues), !bVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x1394,
                       "(!bailOutInfo->capturedValues || bailOutInfo->capturedValues->constantValues.Empty())"
                       ,
                       "!bailOutInfo->capturedValues || bailOutInfo->capturedValues->constantValues.Empty()"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if ((pBVar5->capturedValues != (CapturedValues *)0x0) &&
     (bVar3 = SListBase<JsUtil::KeyValuePair<StackSym_*,_StackSym_*>,_Memory::ArenaAllocator,_RealCount>
              ::Empty(&pBVar5->capturedValues->copyPropSyms), !bVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x1395,
                       "(!bailOutInfo->capturedValues || bailOutInfo->capturedValues->copyPropSyms.Empty())"
                       ,
                       "!bailOutInfo->capturedValues || bailOutInfo->capturedValues->copyPropSyms.Empty()"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if ((pBVar5->liveLosslessInt32Syms != (BVSparse<Memory::JitArenaAllocator> *)0x0) &&
     (bVar3 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(pBVar5->liveLosslessInt32Syms), !bVar3))
  {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x1396,
                       "(!bailOutInfo->liveLosslessInt32Syms || bailOutInfo->liveLosslessInt32Syms->IsEmpty())"
                       ,
                       "!bailOutInfo->liveLosslessInt32Syms || bailOutInfo->liveLosslessInt32Syms->IsEmpty()"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if ((pBVar5->liveFloat64Syms != (BVSparse<Memory::JitArenaAllocator> *)0x0) &&
     (bVar3 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(pBVar5->liveFloat64Syms), !bVar3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x1397,
                       "(!bailOutInfo->liveFloat64Syms || bailOutInfo->liveFloat64Syms->IsEmpty())",
                       "!bailOutInfo->liveFloat64Syms || bailOutInfo->liveFloat64Syms->IsEmpty()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  insertBeforeInstr = (bailInInstr->super_LabelInstr).super_Instr.m_next;
  pRVar1 = this->interpreterFrameRegOpnd;
  src = CreateGeneratorObjectOpnd(this);
  InsertMove(&pRVar1->super_Opnd,&src->super_Opnd,insertBeforeInstr);
  pRVar1 = this->interpreterFrameRegOpnd;
  uVar4 = Js::JavascriptGenerator::GetFrameOffset();
  src_00 = IR::IndirOpnd::New(pRVar1,uVar4,TyUint64,this->func,false);
  InsertMove(&this->interpreterFrameRegOpnd->super_Opnd,&src_00->super_Opnd,insertBeforeInstr);
  bVar3 = Func::HasArgumentSlot(this->func);
  if (bVar3) {
    pRVar1 = this->interpreterFrameRegOpnd;
    uVar4 = Js::InterpreterStackFrame::GetOffsetOfArguments();
    insertionPoint.instrInsertRegSym =
         (Instr *)IR::IndirOpnd::New(pRVar1,uVar4,TyUint64,this->func,false);
    InsertMove(&this->tempRegOpnd->super_Opnd,(Opnd *)insertionPoint.instrInsertRegSym,
               insertBeforeInstr);
    dst = LowererMD::CreateStackArgumentsSlotOpnd(this->func);
    InsertMove(dst,&this->tempRegOpnd->super_Opnd,insertBeforeInstr);
  }
  insertBailInTraceBefore = (Instr *)0x0;
  insertionPoint.raxRestoreInstr = insertBeforeInstr;
  insertionPoint.instrInsertStackSym = insertBeforeInstr;
  BuildBailInSymbolList
            (this,pBVar5->byteCodeUpwardExposedUsed,&bailInInstr->upwardExposedUses,
             &bailInInstr->capturedValues);
  InsertRestoreSymbols
            (this,pBVar5->byteCodeUpwardExposedUsed,&bailInInstr->upwardExposedUses,
             &bailInInstr->capturedValues,(BailInInsertionPoint *)&insertBailInTraceBefore);
  bVar3 = Func::IsStackArgsEnabled(this->func);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x13c5,"(!this->func->IsStackArgsEnabled())",
                       "!this->func->IsStackArgsEnabled()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  sourceContextId = Func::GetSourceContextId(this->func);
  functionId = Func::GetLocalFunctionId(this->func);
  bVar3 = Js::Phases::IsEnabled((Phases *)&DAT_01ec1678,BailInPhase,sourceContextId,functionId);
  if (bVar3) {
    if (insertBeforeInstr->m_opcode != GeneratorOutputBailInTraceLabel) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x13cb,
                         "(insertBailInTraceBefore->m_opcode == Js::OpCode::GeneratorOutputBailInTraceLabel)"
                         ,
                         "insertBailInTraceBefore->m_opcode == Js::OpCode::GeneratorOutputBailInTraceLabel"
                        );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    InsertBailInTrace(this,pBVar5->byteCodeUpwardExposedUsed,insertBeforeInstr->m_next);
  }
  return insertBeforeInstr;
}

Assistant:

IR::Instr* LinearScan::GeneratorBailIn::GenerateBailIn(IR::GeneratorBailInInstr* bailInInstr)
{
    BailOutInfo* bailOutInfo = bailInInstr->yieldInstr->GetBailOutInfo();

    Assert(!bailOutInfo->capturedValues || bailOutInfo->capturedValues->constantValues.Empty());
    Assert(!bailOutInfo->capturedValues || bailOutInfo->capturedValues->copyPropSyms.Empty());
    Assert(!bailOutInfo->liveLosslessInt32Syms || bailOutInfo->liveLosslessInt32Syms->IsEmpty());
    Assert(!bailOutInfo->liveFloat64Syms || bailOutInfo->liveFloat64Syms->IsEmpty());

    IR::Instr* instrAfter = bailInInstr->m_next;

    // 1) Load the generator object that was passed as one of the arguments to the jitted frame
    LinearScan::InsertMove(this->interpreterFrameRegOpnd, this->CreateGeneratorObjectOpnd(), instrAfter);

    // 2) Gets the InterpreterStackFrame pointer into rax
    IR::IndirOpnd* generatorFrameOpnd = IR::IndirOpnd::New(this->interpreterFrameRegOpnd, Js::JavascriptGenerator::GetFrameOffset(), TyMachPtr, this->func);
    LinearScan::InsertMove(this->interpreterFrameRegOpnd, generatorFrameOpnd, instrAfter);

    // 3) Put the Javascript's `arguments` object, which is stored in the interpreter frame, to the jit's stack slot if needed
    //    See BailOutRecord::RestoreValues
    if (this->func->HasArgumentSlot())
    {
        IR::IndirOpnd* generatorArgumentsOpnd = IR::IndirOpnd::New(this->interpreterFrameRegOpnd, Js::InterpreterStackFrame::GetOffsetOfArguments(), TyMachPtr, this->func);
        LinearScan::InsertMove(this->tempRegOpnd, generatorArgumentsOpnd, instrAfter);
        LinearScan::InsertMove(LowererMD::CreateStackArgumentsSlotOpnd(this->func), this->tempRegOpnd, instrAfter);
    }

    BailInInsertionPoint insertionPoint
    {
        nullptr,    /* raxRestoreInstr */
        instrAfter, /* instrInsertStackSym */
        instrAfter  /* instrInsertRegSym */
    };

    // 4) Restore symbols
    // - We don't need to restore argObjSyms because StackArgs is currently not enabled
    //   Commented out here in case we do want to enable it in the future:
    // this->InsertRestoreSymbols(bailOutInfo->capturedValues->argObjSyms, insertionPoint, saveInitializedReg);
    // 
    // - We move all argout symbols right before the call so we don't need to restore argouts either

    this->BuildBailInSymbolList(
        *bailOutInfo->byteCodeUpwardExposedUsed,
        bailInInstr->upwardExposedUses,
        bailInInstr->capturedValues
    );

    this->InsertRestoreSymbols(
        *bailOutInfo->byteCodeUpwardExposedUsed,
        bailInInstr->upwardExposedUses,
        bailInInstr->capturedValues,
        insertionPoint
    );
    Assert(!this->func->IsStackArgsEnabled());

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
    if (PHASE_TRACE(Js::Phase::BailInPhase, this->func))
    {
        IR::Instr* insertBailInTraceBefore = instrAfter;
        Assert(insertBailInTraceBefore->m_opcode == Js::OpCode::GeneratorOutputBailInTraceLabel);
        this->InsertBailInTrace(bailOutInfo->byteCodeUpwardExposedUsed, insertBailInTraceBefore->m_next);
    }
#endif

    return instrAfter;
}